

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing.cpp
# Opt level: O0

void prepare_ide(string *base_path,string *problem_no,int file_no)

{
  char *pcVar1;
  FILE *pFVar2;
  runtime_error *prVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string f_no;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  string *psStack_18;
  int file_no_local;
  string *problem_no_local;
  string *base_path_local;
  
  local_1c = file_no;
  psStack_18 = problem_no;
  problem_no_local = base_path;
  if (file_no == -1) {
    std::operator<<((ostream *)&std::cout,"Which file-set? ");
    std::istream::operator>>((istream *)&std::cin,&local_1c);
  }
  std::operator+(&local_80,problem_no_local,"/in_out_exp_files/");
  std::operator+(&local_60,&local_80,psStack_18);
  std::operator+(&local_40,&local_60,"/");
  std::__cxx11::string::operator=((string *)&sub_path_abi_cxx11_,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::to_string((string *)local_b0,local_1c);
  std::operator+(&local_110,&sub_path_abi_cxx11_,"in");
  std::operator+(&local_f0,&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  std::operator+(&local_d0,&local_f0,".txt");
  std::__cxx11::string::operator=((string *)&in_name_abi_cxx11_,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::operator+(&local_170,&sub_path_abi_cxx11_,"out");
  std::operator+(&local_150,&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  std::operator+(&local_130,&local_150,".txt");
  std::__cxx11::string::operator=((string *)&out_name_abi_cxx11_,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::operator+(&local_1d0,&sub_path_abi_cxx11_,"exp");
  std::operator+(&local_1b0,&local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  std::operator+(&local_190,&local_1b0,".txt");
  std::__cxx11::string::operator=((string *)&expected_name_abi_cxx11_,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::operator+(&local_250,"Reading files for problem ",psStack_18);
  std::operator+(&local_230,&local_250,", file-nr ");
  std::operator+(&local_210,&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  std::operator+(&local_1f0,&local_210,"...");
  write_colored_text(&local_1f0,green);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  old_stdout = dup(1);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pFVar2 = freopen(pcVar1,"r",_stdin);
  if (pFVar2 == (FILE *)0x0) {
    local_271 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_270,"Problems reading from in-file ",&in_name_abi_cxx11_);
    std::runtime_error::runtime_error(prVar3,(string *)&local_270);
    local_271 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pFVar2 = freopen(pcVar1,"w",_stdout);
  if (pFVar2 == (FILE *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_298,"Problems reading from out-file ",&out_name_abi_cxx11_);
    std::runtime_error::runtime_error(prVar3,(string *)&local_298);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  std::__cxx11::string::~string((string *)local_b0);
  return;
}

Assistant:

void prepare_ide(const string &base_path, const string &problem_no, int file_no) {
    if (file_no == -1) {
        cout << "Which file-set? ";
        cin >> file_no;
    }


    sub_path = base_path + "/in_out_exp_files/" + problem_no + "/";
    string f_no = to_string(file_no);
    in_name = sub_path + "in" + f_no + ".txt";
    out_name = sub_path + "out" + f_no + ".txt";
    expected_name = sub_path + "exp" + f_no + ".txt";

    write_colored_text("Reading files for problem " + problem_no + ", file-nr " + f_no + "...", green);

    /*
     * Note: I initially declared the parameter to pass like:
     *            prepare_ide(string problem_no, int file_no) {...}
     * That worked fine,but CLion complained:
     *            "Clang-Tidy: The parameter 'message' is copied for each invocation but only used as a const reference;
     *            consider making it a const reference."
     * With auto-refactoring by CLion, it was changed to a const reference:
     *            prepare_ide(const string &problem_no, int file_no) {...}
     */

    /*
     * For input file:
     * NOTE: this method requires a char* (or char-array) as first parameter.
     * For conversion, use ...c_str()
     * See https://stackoverflow.com/questions/7352099/stdstring-to-char
     *
     * For replacing 'cout', just write 'stdout'
     */

    // First save the old file-descriptors:
    // -> In linux, the following streams are associated:
    //    - 0: stdin
    //    - 1: stdout
    //    - 2: stderr
//    old_stdin = dup(0);
    old_stdout = dup(1);
    if (!freopen(in_name.c_str(), "r", stdin)) {
        throw runtime_error("Problems reading from in-file " + in_name);
    }
    if (!freopen(out_name.c_str(), "w", stdout)) {
        throw runtime_error("Problems reading from out-file " + out_name);
    }

    // Start the code timer:
    start = chrono::high_resolution_clock::now();
}